

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# headers.c
# Opt level: O3

CURLcode Curl_headers_cleanup(Curl_easy *data)

{
  Curl_llist *list;
  Curl_llist_node *n;
  void *pvVar1;
  
  list = &(data->state).httphdrs;
  n = Curl_llist_head(list);
  while (n != (Curl_llist_node *)0x0) {
    pvVar1 = Curl_node_elem(n);
    n = Curl_node_next(n);
    (*Curl_cfree)(pvVar1);
  }
  Curl_llist_init(list,(Curl_llist_dtor)0x0);
  (data->state).prevhead = (Curl_header_store *)0x0;
  return CURLE_OK;
}

Assistant:

CURLcode Curl_headers_cleanup(struct Curl_easy *data)
{
  struct Curl_llist_node *e;
  struct Curl_llist_node *n;

  for(e = Curl_llist_head(&data->state.httphdrs); e; e = n) {
    struct Curl_header_store *hs = Curl_node_elem(e);
    n = Curl_node_next(e);
    free(hs);
  }
  headers_reset(data);
  return CURLE_OK;
}